

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d1_srtp.cc
# Opt level: O0

stack_st_SRTP_PROTECTION_PROFILE * SSL_get_srtp_profiles(SSL *ssl)

{
  bool bVar1;
  pointer pSVar2;
  pointer psVar3;
  SSL *local_20;
  SSL *ssl_local;
  
  if (ssl == (SSL *)0x0) {
    ssl_local = (SSL *)0x0;
  }
  else {
    bVar1 = std::operator==((unique_ptr<bssl::SSL_CONFIG,_bssl::internal::Deleter> *)&ssl->method,
                            (nullptr_t)0x0);
    if (bVar1) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/d1_srtp.cc"
                    ,0x69,
                    "const struct stack_st_SRTP_PROTECTION_PROFILE *SSL_get_srtp_profiles(const SSL *)"
                   );
    }
    pSVar2 = std::unique_ptr<bssl::SSL_CONFIG,_bssl::internal::Deleter>::operator->
                       ((unique_ptr<bssl::SSL_CONFIG,_bssl::internal::Deleter> *)&ssl->method);
    bVar1 = std::operator!=(&pSVar2->srtp_profiles,(nullptr_t)0x0);
    if (bVar1) {
      pSVar2 = std::unique_ptr<bssl::SSL_CONFIG,_bssl::internal::Deleter>::operator->
                         ((unique_ptr<bssl::SSL_CONFIG,_bssl::internal::Deleter> *)&ssl->method);
      local_20 = (SSL *)std::unique_ptr<stack_st_SRTP_PROTECTION_PROFILE,_bssl::internal::Deleter>::
                        get(&pSVar2->srtp_profiles);
    }
    else {
      psVar3 = std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::operator->
                         ((unique_ptr<ssl_ctx_st,_bssl::internal::Deleter> *)&ssl->packet);
      local_20 = (SSL *)std::unique_ptr<stack_st_SRTP_PROTECTION_PROFILE,_bssl::internal::Deleter>::
                        get(&psVar3->srtp_profiles);
    }
    ssl_local = local_20;
  }
  return (stack_st_SRTP_PROTECTION_PROFILE *)ssl_local;
}

Assistant:

const STACK_OF(SRTP_PROTECTION_PROFILE) *SSL_get_srtp_profiles(const SSL *ssl) {
  if (ssl == nullptr) {
    return nullptr;
  }

  if (ssl->config == nullptr) {
    assert(0);
    return nullptr;
  }

  return ssl->config->srtp_profiles != nullptr
             ? ssl->config->srtp_profiles.get()
             : ssl->ctx->srtp_profiles.get();
}